

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_seq_cst.h
# Opt level: O1

ControlBlock * __thiscall
density::detail::
LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::create_initial_page
          (LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
           *this,LfQueue_ProgressGuarantee i_progress_guarantee)

{
  ControlBlock *i_new_page;
  ControlBlock *pCVar1;
  bool bVar2;
  
  i_new_page = create_page(this,i_progress_guarantee);
  if (i_new_page == (ControlBlock *)0x0) {
    pCVar1 = (ControlBlock *)0x0;
  }
  else {
    LOCK();
    pCVar1 = (this->m_initial_page)._M_b._M_p;
    bVar2 = pCVar1 == (ControlBlock *)0x0;
    if (bVar2) {
      (this->m_initial_page)._M_b._M_p = i_new_page;
      pCVar1 = (ControlBlock *)0x0;
    }
    UNLOCK();
    if (!bVar2) {
      discard_created_page(this,i_new_page);
      i_new_page = pCVar1;
    }
    LOCK();
    pCVar1 = (ControlBlock *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
    bVar2 = pCVar1 == (ControlBlock *)0xffc0;
    if (bVar2) {
      (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)i_new_page;
      pCVar1 = (ControlBlock *)0xffc0;
    }
    UNLOCK();
    if (bVar2) {
      pCVar1 = i_new_page;
    }
  }
  return pCVar1;
}

Assistant:

DENSITY_NO_INLINE ControlBlock *
                              create_initial_page(LfQueue_ProgressGuarantee i_progress_guarantee)
            {
                // m_initial_page = initial_page = create_page()
                auto const first_page = create_page(i_progress_guarantee);
                if (first_page == nullptr)
                {
                    return nullptr;
                }

                /* note: in case of failure of the following CAS we do not give in even if we are wait-free,
                    because this is a one-shot operation, so we can't possibly stick in a loop. */
                ControlBlock * initial_page = nullptr;
                if (m_initial_page.compare_exchange_strong(initial_page, first_page))
                {
                    initial_page = first_page;
                }
                else
                {
                    discard_created_page(first_page);
                }

                // m_tail = initial_page;
                auto tail = s_invalid_control_block;
                if (m_tail.compare_exchange_strong(tail, reinterpret_cast<uintptr_t>(initial_page)))
                {
                    return initial_page;
                }
                else
                {
                    return reinterpret_cast<ControlBlock *>(tail);
                }
            }